

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O0

void rmlLinkedListEach(void *self,rmlLinkedListEachCallback callback,void *attachment)

{
  _Bool _Var1;
  undefined8 *local_60;
  rmlLinkedListItem *current;
  int64_t index;
  rmlLinkedListEachCallbackContext context;
  rmlLinkedList *selfList;
  void *attachment_local;
  rmlLinkedListEachCallback callback_local;
  void *self_local;
  
  current = (rmlLinkedListItem *)0x0;
  local_60 = *self;
  index = (int64_t)attachment;
  context.valueItem = self;
  context.index = (int64_t)self;
  while ((local_60 != (undefined8 *)0x0 && (callback != (rmlLinkedListEachCallback)0x0))) {
    context.value = local_60;
    context.attachment = (void *)*local_60;
    context.linkedList = current;
    _Var1 = (*callback)((rmlLinkedListEachCallbackContext *)&index);
    if (_Var1) {
      return;
    }
    current = (rmlLinkedListItem *)((long)&current->value_ + 1);
    local_60 = (undefined8 *)local_60[2];
  }
  return;
}

Assistant:

void rmlLinkedListEach(void *self, rmlLinkedListEachCallback callback, void *attachment) {
    struct rmlLinkedList *selfList = self;
    rmlLinkedListEachCallbackContext context;
    context.linkedList = selfList;
    context.attachment = attachment;
    int64_t index = 0;
    for (struct rmlLinkedListItem *current = selfList->head_; current != NULL; current = current->next_) {
        if (callback == NULL) {
            break;
        }

        context.valueItem = current;
        context.value = current->value_;
        context.index = index;
        if (callback(&context)) {
            break;
        }
        index++;
    }
}